

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_tga_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  int n;
  int r;
  stbi s;
  FILE *f_local;
  
  s.img_buffer_end = (uint8 *)f;
  lVar2 = ftell((FILE *)f);
  start_file((stbi *)&n,(FILE *)s.img_buffer_end);
  iVar1 = tga_test((stbi *)&n);
  fseek((FILE *)s.img_buffer_end,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int      stbi_tga_test_file        (FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = tga_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}